

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

AtomicNotify * __thiscall
wasm::Builder::makeAtomicNotify
          (Builder *this,Expression *ptr,Expression *notifyCount,Address offset,Name memory)

{
  AtomicNotify *pAVar1;
  
  pAVar1 = MixedArena::alloc<wasm::AtomicNotify>((MixedArena *)(this->wasm + 0x200));
  (pAVar1->offset).addr = offset.addr;
  pAVar1->ptr = ptr;
  pAVar1->notifyCount = notifyCount;
  wasm::AtomicNotify::finalize();
  (pAVar1->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pAVar1->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  return pAVar1;
}

Assistant:

AtomicNotify* makeAtomicNotify(Expression* ptr,
                                 Expression* notifyCount,
                                 Address offset,
                                 Name memory) {
    auto* notify = wasm.allocator.alloc<AtomicNotify>();
    notify->offset = offset;
    notify->ptr = ptr;
    notify->notifyCount = notifyCount;
    notify->finalize();
    notify->memory = memory;
    return notify;
  }